

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3_00;
  string *value;
  undefined8 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe98 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffed0;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [56];
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)local_88,(string *)values);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_88 + 0x20),(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(local_88 + 0x20));
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)local_88);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,(string *)param);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffeb8,(string *)params);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffe98,(string *)params_1);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)params_2._M_dataplus._M_p);
  ::std::__cxx11::string::string(local_c8,(string *)params_2._M_string_length);
  ::std::__cxx11::string::string(local_e8,(string *)params_2.field_2._M_allocated_capacity);
  ::std::__cxx11::string::string(local_108,(string *)params_2.field_2._8_8_);
  params_2_00._M_string_length = (size_type)local_e8;
  params_2_00._M_dataplus._M_p = (pointer)local_c8;
  params_2_00.field_2._M_allocated_capacity = (size_type)local_108;
  params_2_00.field_2._8_8_ = in_stack_fffffffffffffe88;
  params_3_00._M_string_length = in_stack_fffffffffffffe98._0_8_;
  params_3_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffe98._8_16_;
  params_3_00._M_dataplus._M_p = (pointer)this;
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &stack0xfffffffffffffed8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffeb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffe98,&local_a8,params_2_00,params_3_00,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffed0);
  ::std::__cxx11::string::~string(local_108);
  ::std::__cxx11::string::~string(local_e8);
  ::std::__cxx11::string::~string(local_c8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}